

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *vec)

{
  type_conflict5 tVar1;
  long in_RSI;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  int j;
  int k;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int r;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffff08;
  undefined1 local_e8 [16];
  self_type *in_stack_ffffffffffffff28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff30;
  int local_ac;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  int local_68;
  uint local_64;
  long local_60;
  long local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  const_reference local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  const_reference local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_64 = (in_RDI->data)._M_elems[1];
  local_60 = in_RSI;
  while (local_64 = local_64 - 1, -1 < (int)local_64) {
    local_68 = *(int *)(*(long *)in_RDI[8].data._M_elems + (long)(int)local_64 * 4);
    local_50 = local_60 + (long)local_68 * 0x38;
    local_48 = &local_a0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_RDI,in_stack_ffffffffffffff08);
    tVar1 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffff08,(double *)0x368c06);
    if (tVar1) {
      for (local_ac = *(int *)(*(long *)&in_RDI[7].fpclass + (long)local_68 * 4);
          local_ac < *(int *)(*(long *)&in_RDI[7].fpclass + (long)(local_68 + 1) * 4);
          local_ac = local_ac + 1) {
        local_38 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI[7].data._M_elems + 4),(long)local_ac);
        local_28 = local_e8;
        local_30 = &local_a0;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_30,local_38);
        local_20 = local_e8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI);
        local_8 = local_e8;
        local_10 = local_30;
        local_18 = local_38;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (in_RDI,in_stack_ffffffffffffff08,(cpp_dec_float<50U,_int,_void> *)0x368d20);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator-=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleft(R* vec) const
{

#ifndef SOPLEX_WITH_L_ROWS
   int*  idx;
   R* val;
   R* lval  = l.val.data();
   int*  lidx  = l.idx;
   int*  lrow  = l.row;
   int*  lbeg  = l.start;

   for(int i = l.firstUpdate - 1; i >= 0; --i)
   {
      int k = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(int j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   for(int i = thedim - 1; i >= 0; --i)
   {
      int  r = l.rorig[i];
      R x = vec[r];

      if(x != 0.0)
      {
         for(int k = l.rbeg[r]; k < l.rbeg[r + 1]; k++)
         {
            int j = l.ridx[k];

            assert(l.rperm[j] < i);

            vec[j] -= x * l.rval[k];
         }
      }
   }

#endif // SOPLEX_WITH_L_ROWS
}